

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_get_attribute_by_name
          (exr_const_context_t_conflict ctxt,int part_index,char *name,exr_attribute_t **outattr)

{
  exr_result_t eVar1;
  exr_attribute_t *in_RAX;
  exr_context_t nonc;
  exr_attribute_t *tmpptr;
  exr_attribute_t *local_28;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    eVar1 = 2;
  }
  else {
    local_28 = in_RAX;
    if (ctxt->mode == '\x01') {
      pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
    }
    if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar1 = (*ctxt->print_error)
                        (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                         ctxt->print_error);
      return eVar1;
    }
    if (outattr == (exr_attribute_t **)0x0) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar1 = (*ctxt->standard_error)(ctxt,3);
      return eVar1;
    }
    eVar1 = exr_attr_list_find_by_name
                      (ctxt,&ctxt->parts[(uint)part_index]->attributes,name,&local_28);
    if (eVar1 == 0) {
      *outattr = local_28;
    }
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_get_attribute_by_name (
    exr_const_context_t     ctxt,
    int                     part_index,
    const char*             name,
    const exr_attribute_t** outattr)
{
    exr_attribute_t* tmpptr;
    exr_result_t     rv;
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

    if (!outattr)
        return EXR_UNLOCK_WRITE_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT));

    rv = exr_attr_list_find_by_name (
        EXR_CONST_CAST (exr_context_t, ctxt),
        EXR_CONST_CAST (exr_attribute_list_t*, &(part->attributes)),
        name,
        &tmpptr);
    if (rv == EXR_ERR_SUCCESS) *outattr = tmpptr;
    return EXR_UNLOCK_WRITE_AND_RETURN (rv);
}